

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O1

void __thiscall
slang::ast::CoverCrossSymbol::serializeTo(CoverCrossSymbol *this,ASTSerializer *serializer)

{
  size_type sVar1;
  pointer ppCVar2;
  Symbol *value;
  Expression *pEVar3;
  long lVar4;
  CoverageOptionSetter *opt;
  pointer this_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  
  name._M_str = "targets";
  name._M_len = 7;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->targets).size_;
  if (sVar1 != 0) {
    ppCVar2 = (this->targets).data_;
    lVar4 = 0;
    do {
      value = *(Symbol **)((long)ppCVar2 + lVar4);
      ASTSerializer::startObject(serializer);
      name_00._M_str = "coverpoint";
      name_00._M_len = 10;
      ASTSerializer::writeLink(serializer,name_00,value);
      ASTSerializer::endObject(serializer);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  ASTSerializer::endArray(serializer);
  if ((this->options).size_ != 0) {
    name_01._M_str = "options";
    name_01._M_len = 7;
    ASTSerializer::startArray(serializer,name_01);
    sVar1 = (this->options).size_;
    if (sVar1 != 0) {
      this_00 = (this->options).data_;
      lVar4 = sVar1 * 0x18;
      do {
        pEVar3 = CoverageOptionSetter::getExpression(this_00);
        ASTSerializer::write(serializer,4,"expr",(size_t)pEVar3);
        this_00 = this_00 + 1;
        lVar4 = lVar4 + -0x18;
      } while (lVar4 != 0);
    }
    ASTSerializer::endArray(serializer);
  }
  pEVar3 = getIffExpr(this);
  if (pEVar3 != (Expression *)0x0) {
    ASTSerializer::write(serializer,3,"iff",(size_t)pEVar3);
    return;
  }
  return;
}

Assistant:

void CoverCrossSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("targets");
    for (auto target : targets) {
        serializer.startObject();
        serializer.writeLink("coverpoint", *target);
        serializer.endObject();
    }
    serializer.endArray();

    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options)
            opt.serializeTo(serializer);
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}